

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O1

PlainObject * __thiscall Eigen::ProductBase::operator_cast_to_Matrix_(ProductBase *this)

{
  DenseStorage<double,__1,__1,__1,_0> *this_00;
  ulong nbRows;
  ulong nbCols;
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  undefined8 in_RSI;
  Scalar local_30;
  ulong local_28;
  undefined8 local_20;
  
  nbRows = *(ulong *)(*(long *)this + 8);
  nbCols = *(ulong *)(*(long *)(this + 8) + 8);
  if ((long)(nbCols | nbRows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hq-jiang[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((nbCols != 0 && nbRows != 0) &&
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar1 / SEXT816((long)nbCols),0) < (long)nbRows)) {
    puVar2 = (undefined8 *)
             __cxa_allocate_exception(8,in_RSI,SUB168(auVar1 % SEXT816((long)nbCols),0));
    *puVar2 = operator_delete;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  this_00 = (DenseStorage<double,__1,__1,__1,_0> *)(this + 0x10);
  DenseStorage<double,_-1,_-1,_-1,_0>::resize(this_00,nbCols * nbRows,nbRows,nbCols);
  local_30 = *(Scalar *)(this + 0x18);
  local_28 = *(ulong *)(this + 0x20);
  local_20 = 0;
  if (-1 < (long)(local_28 | (ulong)local_30)) {
    PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_30);
    local_30 = 1.0;
    GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,5>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,5>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>
                *)this,(Matrix<double,__1,__1,_0,__1,__1> *)this_00,&local_30);
    return (PlainObject *)this_00;
  }
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/hq-jiang[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

operator const PlainObject& () const
    {
      m_result.resize(m_lhs.rows(), m_rhs.cols());
      derived().evalTo(m_result);
      return m_result;
    }